

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509.c
# Opt level: O3

int x509_date_is_valid(mbedtls_x509_time *t)

{
  uint uVar1;
  uint uVar2;
  short sVar3;
  int iVar4;
  int iVar5;
  
  uVar1 = t->year;
  iVar4 = -0x2400;
  if ((((uVar1 < 10000) && ((uint)t->hour < 0x18)) && ((uint)t->min < 0x3c)) &&
     (((uint)t->sec < 0x3c && (uVar2 = t->mon, uVar2 < 0xd)))) {
    iVar5 = 0x1f;
    if ((0x15aaU >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0xa50U >> (uVar2 & 0x1f) & 1) == 0) {
        if (uVar2 != 2) {
          return -0x2400;
        }
        sVar3 = (short)uVar1;
        if (((uVar1 & 3) != 0) ||
           (iVar5 = 0x1d, sVar3 == (short)((short)((uVar1 & 0xffff) / 100) * 100))) {
          iVar5 = ((ushort)((ushort)(sVar3 * 0x5c29) >> 4 | sVar3 * -0x7000) < 0xa4) + 0x1c;
        }
      }
      else {
        iVar5 = 0x1e;
      }
    }
    iVar4 = 0;
    if (iVar5 < t->day) {
      iVar4 = -0x2400;
    }
    if (t->day < 1) {
      iVar4 = -0x2400;
    }
  }
  return iVar4;
}

Assistant:

static int x509_date_is_valid(const mbedtls_x509_time *t )
{
    int ret = MBEDTLS_ERR_X509_INVALID_DATE;
    int month_len;

    CHECK_RANGE( 0, 9999, t->year );
    CHECK_RANGE( 0, 23,   t->hour );
    CHECK_RANGE( 0, 59,   t->min  );
    CHECK_RANGE( 0, 59,   t->sec  );

    switch( t->mon )
    {
        case 1: case 3: case 5: case 7: case 8: case 10: case 12:
            month_len = 31;
            break;
        case 4: case 6: case 9: case 11:
            month_len = 30;
            break;
        case 2:
            if( ( !( t->year % 4 ) && t->year % 100 ) ||
                !( t->year % 400 ) )
                month_len = 29;
            else
                month_len = 28;
            break;
        default:
            return( ret );
    }
    CHECK_RANGE( 1, month_len, t->day );

    return( 0 );
}